

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_connection::fail_impl
          (tracker_connection *this,error_code *ec,operation_t op,string *msg,seconds32 interval,
          seconds32 min_interval)

{
  bool bVar1;
  rep_conflict rVar2;
  element_type *peVar3;
  tracker_connection **local_90;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  string *msg_local;
  operation_t op_local;
  error_code *ec_local;
  tracker_connection *this_local;
  seconds32 min_interval_local;
  seconds32 interval_local;
  
  cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg;
  this_local._0_4_ = min_interval.__r;
  this_local._4_4_ = interval.__r;
  requester((tracker_connection *)local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    rVar2 = ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::count
                      ((duration<int,_std::ratio<1L,_1L>_> *)((long)&this_local + 4));
    if (rVar2 == 0) {
      local_90 = &this_local;
    }
    else {
      local_90 = (tracker_connection **)((long)&this_local + 4);
    }
    (*peVar3->_vptr_request_callback[5])
              (peVar3,&this->m_req,ec,(ulong)op,msg,(ulong)*(uint *)local_90);
  }
  (*(this->super_timeout_handler)._vptr_timeout_handler[4])();
  ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
            ((shared_ptr<libtorrent::aux::request_callback> *)local_40);
  return;
}

Assistant:

void tracker_connection::fail_impl(error_code const& ec, operation_t const op
		, std::string const msg, seconds32 const interval, seconds32 const min_interval)
	{
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->tracker_request_error(m_req, ec, op, msg
			, interval.count() == 0 ? min_interval : interval);
		close();
	}